

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_setup(nk_context *ctx,nk_user_font *font)

{
  nk_context *__s;
  size_t __n;
  size_t __n_00;
  
  if (ctx != (nk_context *)0x0) {
    __n_00 = (ulong)ctx & 3;
    if (__n_00 == 0) {
      __n_00 = 0x40f0;
      __s = ctx;
    }
    else {
      __n = -__n_00 + 4;
      memset(ctx,0,__n);
      memset((void *)((long)ctx + __n),0,0x40ec);
      __s = (nk_context *)((long)ctx + -__n_00 + 0x40f0);
    }
    memset(__s,0,__n_00);
    nk_style_from_table(ctx,(nk_color *)0x0);
    ctx->seq = 1;
    if (font != (nk_user_font *)0x0) {
      (ctx->style).font = font;
    }
    nk_draw_list_init(&ctx->draw_list);
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x3a1b,"void nk_setup(struct nk_context *, const struct nk_user_font *)");
}

Assistant:

NK_INTERN void
nk_setup(struct nk_context *ctx, const struct nk_user_font *font)
{
    NK_ASSERT(ctx);
    if (!ctx) return;
    nk_zero_struct(*ctx);
    nk_style_default(ctx);
    ctx->seq = 1;
    if (font) ctx->style.font = font;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_init(&ctx->draw_list);
#endif
}